

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceGraph.cc
# Opt level: O2

unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> * __thiscall
DistanceGraph::get_connected_nodes
          (unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
           *__return_storage_ptr__,DistanceGraph *this)

{
  pointer pvVar1;
  long lVar2;
  int n;
  ulong uVar3;
  ulong local_70;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> r;
  
  r._M_h._M_buckets = &r._M_h._M_single_bucket;
  r._M_h._M_bucket_count = 1;
  r._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  r._M_h._M_element_count = 0;
  r._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  r._M_h._M_rehash_policy._M_next_resize = 0;
  r._M_h._M_single_bucket = (__node_base_ptr)0x0;
  lVar2 = 0x20;
  for (uVar3 = 1;
      pvVar1 = (this->links).
               super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)(((long)(this->links).
                             super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18);
      uVar3 = uVar3 + 1) {
    if (*(long *)((long)pvVar1 + lVar2 + -8) !=
        *(long *)((long)&(pvVar1->super__Vector_base<Link,_std::allocator<Link>_>)._M_impl.
                         super__Vector_impl_data + lVar2)) {
      local_70 = uVar3;
      std::__detail::
      _Insert<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
      ::insert((_Insert<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                *)&r,(value_type *)&local_70);
    }
    lVar2 = lVar2 + 0x18;
  }
  std::
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_Hashtable(&__return_storage_ptr__->_M_h,&r._M_h);
  std::
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&r._M_h);
  return __return_storage_ptr__;
}

Assistant:

std::unordered_set<sgNodeID_t> DistanceGraph::get_connected_nodes() const {
    std::unordered_set<sgNodeID_t> r;
    for (auto n=1;n<links.size();++n) if (!links[n].empty()) r.insert(n);
    return std::move(r);
}